

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool wallet::LoadCryptedKey(CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  LegacyDataSPKM *this;
  pointer pbVar4;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchPrivKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  uint256 checksum;
  CPubKey vchPubKey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  unique_lock<std::recursive_mutex> local_d8;
  base_blob<256U> local_c8;
  base_blob<256U> local_a8;
  CPubKey local_79;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_d8,&pwallet->cs_wallet,
             "pwallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
             ,0x180,false);
  local_79.vch[0] = 0xff;
  CPubKey::Unserialize<DataStream>(&local_79,ssKey);
  if (((local_79.vch[0] & 0xfe) != 2) &&
     ((7 < local_79.vch[0] || ((0xd0U >> (local_79.vch[0] & 0x1f) & 1) == 0)))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (strErr,"Error reading wallet database: CPubKey corrupt");
    bVar2 = false;
    goto LAB_00199739;
  }
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
            (ssValue,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  pbVar1 = (ssValue->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = (ssValue->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + ssValue->m_read_pos;
  if (pbVar4 == pbVar1) {
LAB_001996e8:
    this = CWallet::GetOrCreateLegacyDataSPKM(pwallet);
    bVar3 = LegacyDataSPKM::LoadCryptedKey
                      (this,&local_79,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                       pbVar4 != pbVar1);
    bVar2 = true;
    if (!bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (strErr,"Error reading wallet database: LegacyDataSPKM::LoadCryptedKey failed");
      goto LAB_0019972f;
    }
  }
  else {
    local_a8.m_data._M_elems[0x10] = '\0';
    local_a8.m_data._M_elems[0x11] = '\0';
    local_a8.m_data._M_elems[0x12] = '\0';
    local_a8.m_data._M_elems[0x13] = '\0';
    local_a8.m_data._M_elems[0x14] = '\0';
    local_a8.m_data._M_elems[0x15] = '\0';
    local_a8.m_data._M_elems[0x16] = '\0';
    local_a8.m_data._M_elems[0x17] = '\0';
    local_a8.m_data._M_elems[0x18] = '\0';
    local_a8.m_data._M_elems[0x19] = '\0';
    local_a8.m_data._M_elems[0x1a] = '\0';
    local_a8.m_data._M_elems[0x1b] = '\0';
    local_a8.m_data._M_elems[0x1c] = '\0';
    local_a8.m_data._M_elems[0x1d] = '\0';
    local_a8.m_data._M_elems[0x1e] = '\0';
    local_a8.m_data._M_elems[0x1f] = '\0';
    local_a8.m_data._M_elems[0] = '\0';
    local_a8.m_data._M_elems[1] = '\0';
    local_a8.m_data._M_elems[2] = '\0';
    local_a8.m_data._M_elems[3] = '\0';
    local_a8.m_data._M_elems[4] = '\0';
    local_a8.m_data._M_elems[5] = '\0';
    local_a8.m_data._M_elems[6] = '\0';
    local_a8.m_data._M_elems[7] = '\0';
    local_a8.m_data._M_elems[8] = '\0';
    local_a8.m_data._M_elems[9] = '\0';
    local_a8.m_data._M_elems[10] = '\0';
    local_a8.m_data._M_elems[0xb] = '\0';
    local_a8.m_data._M_elems[0xc] = '\0';
    local_a8.m_data._M_elems[0xd] = '\0';
    local_a8.m_data._M_elems[0xe] = '\0';
    local_a8.m_data._M_elems[0xf] = '\0';
    base_blob<256U>::Unserialize<DataStream>(&local_a8,ssValue);
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((uint256 *)&local_c8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
    bVar2 = ::operator==(&local_c8,&local_a8);
    if (bVar2) goto LAB_001996e8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (strErr,"Error reading wallet database: Encrypted key corrupt");
LAB_0019972f:
    bVar2 = false;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
LAB_00199739:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadCryptedKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CPubKey vchPubKey;
        ssKey >> vchPubKey;
        if (!vchPubKey.IsValid())
        {
            strErr = "Error reading wallet database: CPubKey corrupt";
            return false;
        }
        std::vector<unsigned char> vchPrivKey;
        ssValue >> vchPrivKey;

        // Get the checksum and check it
        bool checksum_valid = false;
        if (!ssValue.eof()) {
            uint256 checksum;
            ssValue >> checksum;
            if (!(checksum_valid = Hash(vchPrivKey) == checksum)) {
                strErr = "Error reading wallet database: Encrypted key corrupt";
                return false;
            }
        }

        if (!pwallet->GetOrCreateLegacyDataSPKM()->LoadCryptedKey(vchPubKey, vchPrivKey, checksum_valid))
        {
            strErr = "Error reading wallet database: LegacyDataSPKM::LoadCryptedKey failed";
            return false;
        }
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}